

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O1

void UnityPrintNumberHex(_U_UINT number,char nibbles_to_print)

{
  uint uVar1;
  char nibbles;
  int __c;
  long lVar2;
  long lVar3;
  
  if ('\0' < nibbles_to_print) {
    lVar3 = (ulong)(byte)nibbles_to_print * 4;
    lVar2 = (ulong)(byte)nibbles_to_print + 1;
    do {
      lVar3 = lVar3 + -4;
      uVar1 = (uint)(number >> ((byte)lVar3 & 0x3f)) & 0xf;
      __c = uVar1 + 0x30;
      if (9 < uVar1) {
        __c = uVar1 + 0x37;
      }
      putchar(__c);
      lVar2 = lVar2 + -1;
    } while (1 < lVar2);
  }
  return;
}

Assistant:

void UnityPrintNumberHex(const _U_UINT number, const char nibbles_to_print)
{
    _U_UINT nibble;
    char nibbles = nibbles_to_print;

    while (nibbles > 0)
    {
        nibble = (number >> (--nibbles << 2)) & 0x0000000F;
        if (nibble <= 9)
        {
            UNITY_OUTPUT_CHAR((char)('0' + nibble));
        }
        else
        {
            UNITY_OUTPUT_CHAR((char)('A' - 10 + nibble));
        }
    }
}